

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

void xxHash32_test(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if ((uint)len < 0x10) {
    uVar4 = seed + 0x165667b1 + len;
    switch(len & 0xf) {
    case 0:
      goto switchD_00108eba_caseD_0;
    case 2:
      goto switchD_00108eba_caseD_2;
    case 3:
      goto switchD_00108eba_caseD_3;
    case 4:
      goto switchD_00108eba_caseD_4;
    case 5:
      goto switchD_00108eba_caseD_5;
    case 6:
      goto switchD_00108eba_caseD_6;
    case 7:
      goto switchD_00108eba_caseD_7;
    case 8:
      goto switchD_00108eba_caseD_8;
    case 9:
      goto switchD_00108eba_caseD_9;
    case 10:
      goto switchD_00108eba_caseD_a;
    case 0xb:
      goto switchD_00108eba_caseD_b;
    case 0xc:
      goto switchD_00108eba_caseD_c;
    case 0xd:
      goto switchD_00108eba_caseD_d;
    case 0xe:
      goto switchD_00108eba_caseD_e;
    case 0xf:
      goto switchD_00108eba_caseD_f;
    }
  }
  else {
    pbVar1 = (byte *)((long)key + (long)len + -0xf);
    uVar6 = seed + 0x24234428;
    uVar8 = seed + 0x85ebca77;
    uVar4 = seed + 0x61c8864f;
    do {
      uVar6 = *key * -0x7a143589 + uVar6;
      uVar7 = uVar6 >> 0x13 | uVar6 * 0x2000;
      uVar6 = uVar7 * -0x61c8864f;
      uVar8 = *(int *)((long)key + 4) * -0x7a143589 + uVar8;
      uVar9 = uVar8 >> 0x13 | uVar8 * 0x2000;
      uVar8 = uVar9 * -0x61c8864f;
      uVar10 = *(int *)((long)key + 8) * -0x7a143589 + seed;
      uVar10 = uVar10 >> 0x13 | uVar10 * 0x2000;
      seed = uVar10 * -0x61c8864f;
      uVar4 = *(int *)((long)key + 0xc) * -0x7a143589 + uVar4;
      uVar5 = uVar4 >> 0x13 | uVar4 * 0x2000;
      uVar4 = uVar5 * -0x61c8864f;
      key = (void *)((long)key + 0x10);
    } while (key < pbVar1);
    uVar4 = (uVar4 >> 0xe | uVar5 * -0x193c0000) + (seed >> 0x14 | uVar10 * 0x779b1000) +
            (uVar8 >> 0x19 | uVar9 * 0x1bbcd880) + (uVar6 >> 0x1f | uVar7 * 0x3c6ef362) + len;
    switch(len & 0xf) {
    case 0:
      goto switchD_00108eba_caseD_0;
    case 1:
      break;
    case 3:
switchD_00108eba_caseD_3:
      bVar2 = *key;
      key = (void *)((long)key + 1);
      uVar4 = (uint)bVar2 * 0x165667b1 + uVar4;
      uVar4 = (uVar4 >> 0x15 | uVar4 * 0x800) * -0x61c8864f;
    case 2:
switchD_00108eba_caseD_2:
      bVar2 = *key;
      key = (void *)((long)key + 1);
      uVar4 = (uint)bVar2 * 0x165667b1 + uVar4;
      uVar4 = (uVar4 >> 0x15 | uVar4 * 0x800) * -0x61c8864f;
      break;
    case 4:
      goto switchD_00108eba_caseD_4;
    case 5:
      goto switchD_00108eba_caseD_5;
    case 6:
      goto switchD_00108eba_caseD_6;
    case 7:
      goto switchD_00108eba_caseD_7;
    case 0xc:
switchD_00108eba_caseD_c:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
    case 8:
switchD_00108eba_caseD_8:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
      goto switchD_00108eba_caseD_4;
    case 0xd:
switchD_00108eba_caseD_d:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
    case 9:
switchD_00108eba_caseD_9:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
      goto switchD_00108eba_caseD_5;
    case 0xe:
switchD_00108eba_caseD_e:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
    case 10:
switchD_00108eba_caseD_a:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
      goto switchD_00108eba_caseD_6;
    case 0xf:
switchD_00108eba_caseD_f:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
    case 0xb:
switchD_00108eba_caseD_b:
      uVar4 = *key * -0x3d4d51c3 + uVar4;
      key = (void *)((long)key + 4);
      uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
      goto switchD_00108eba_caseD_7;
    }
  }
  uVar4 = (uint)*key * 0x165667b1 + uVar4;
  uVar4 = uVar4 >> 0x15 | uVar4 * 0x800;
  goto LAB_0010906a;
switchD_00108eba_caseD_7:
  uVar4 = *key * -0x3d4d51c3 + uVar4;
  key = (void *)((long)key + 4);
  uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
  goto switchD_00108eba_caseD_3;
switchD_00108eba_caseD_6:
  uVar4 = *key * -0x3d4d51c3 + uVar4;
  uVar4 = (uint)*(byte *)((long)key + 4) * 0x165667b1 +
          (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
  iVar3 = (uVar4 >> 0x15 | uVar4 * 0x800) * -0x61c8864f;
  bVar2 = *(byte *)((long)key + 5);
  goto LAB_0010905c;
switchD_00108eba_caseD_5:
  uVar4 = *key * -0x3d4d51c3 + uVar4;
  iVar3 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
  bVar2 = *(byte *)((long)key + 4);
LAB_0010905c:
  uVar4 = (uint)bVar2 * 0x165667b1 + iVar3;
  uVar4 = uVar4 >> 0x15 | uVar4 * 0x800;
LAB_0010906a:
  uVar4 = uVar4 * -0x61c8864f;
  goto switchD_00108eba_caseD_0;
switchD_00108eba_caseD_4:
  uVar4 = *key * -0x3d4d51c3 + uVar4;
  uVar4 = (uVar4 >> 0xf | uVar4 * 0x20000) * 0x27d4eb2f;
switchD_00108eba_caseD_0:
  uVar4 = (uVar4 >> 0xf ^ uVar4) * -0x7a143589;
  uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51c3;
  *(uint *)out = uVar4 >> 0x10 ^ uVar4;
  return;
}

Assistant:

XXH_FORCE_INLINE U32
XXH32_endian_align(const void* input, size_t len, U32 seed, XXH_alignment align)
{
    const BYTE* p = (const BYTE*)input;
    const BYTE* bEnd = p + len;
    U32 h32;

#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && (XXH_ACCEPT_NULL_INPUT_POINTER>=1)
    if (p==NULL) {
        len=0;
        bEnd=p=(const BYTE*)(size_t)16;
    }
#endif

    if (len>=16) {
        const BYTE* const limit = bEnd - 15;
        U32 v1 = seed + PRIME32_1 + PRIME32_2;
        U32 v2 = seed + PRIME32_2;
        U32 v3 = seed + 0;
        U32 v4 = seed - PRIME32_1;

        do {
            v1 = XXH32_round(v1, XXH_get32bits(p)); p+=4;
            v2 = XXH32_round(v2, XXH_get32bits(p)); p+=4;
            v3 = XXH32_round(v3, XXH_get32bits(p)); p+=4;
            v4 = XXH32_round(v4, XXH_get32bits(p)); p+=4;
        } while (p < limit);

        h32 = XXH_rotl32(v1, 1)  + XXH_rotl32(v2, 7)
            + XXH_rotl32(v3, 12) + XXH_rotl32(v4, 18);
    } else {
        h32  = seed + PRIME32_5;
    }

    h32 += (U32)len;

    return XXH32_finalize(h32, p, len&15, align);
}